

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TER.cpp
# Opt level: O2

string * __thiscall
jbcoin::transHuman_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,TER code)

{
  bool bVar1;
  string text;
  string token;
  allocator local_49;
  string local_48;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  bVar1 = transResultInfo((TER)this,&local_28,&local_48);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_48);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"-",&local_49);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string transHuman (TER code)
{
    std::string token;
    std::string text;

    return transResultInfo (code, token, text) ? text : "-";
}